

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
::reserve(vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
          *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  memory_resource *pmVar3;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar8;
  ulong uVar9;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar7;
  
  if (this->nAlloc < n) {
    pmVar3 = (this->alloc).memoryResource;
    iVar6 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,n << 5,8);
    pvVar7 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)CONCAT44(extraout_var,iVar6)
    ;
    if (this->nStored != 0) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        pvVar4 = this->ptr;
        *(undefined8 *)((long)&(pvVar7->alloc).memoryResource + lVar8) =
             *(undefined8 *)((long)&(pvVar4->alloc).memoryResource + lVar8);
        puVar1 = (undefined8 *)((long)&pvVar7->ptr + lVar8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&pvVar7->nStored + lVar8) = 0;
        puVar2 = (undefined8 *)((long)&pvVar4->nAlloc + lVar8);
        uVar5 = puVar2[1];
        puVar1 = (undefined8 *)((long)&pvVar7->nAlloc + lVar8);
        *puVar1 = *puVar2;
        puVar1[1] = uVar5;
        *(undefined8 *)((long)&pvVar7->ptr + lVar8) = *(undefined8 *)((long)&pvVar4->ptr + lVar8);
        *(undefined8 *)((long)&pvVar4->nStored + lVar8) = 0;
        puVar1 = (undefined8 *)((long)&pvVar4->ptr + lVar8);
        *puVar1 = 0;
        puVar1[1] = 0;
        vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                   ((long)&(this->ptr->alloc).memoryResource + lVar8));
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x20;
      } while (uVar9 < this->nStored);
    }
    pmVar3 = (this->alloc).memoryResource;
    (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->ptr,this->nAlloc << 5,8);
    this->nAlloc = n;
    this->ptr = pvVar7;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }